

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unames.cpp
# Opt level: O0

uint16_t icu_63::getName(UCharNames *names,uint32_t code,UCharNameChoice nameChoice,char *buffer,
                        uint16_t bufferLength)

{
  uint16_t *group_00;
  uint16_t *group;
  uint16_t bufferLength_local;
  char *buffer_local;
  UCharNameChoice nameChoice_local;
  uint32_t code_local;
  UCharNames *names_local;
  
  group_00 = getGroup(names,code);
  if ((code >> 5 & 0xffff) == (uint)*group_00) {
    names_local._6_2_ =
         expandGroupName(names,group_00,(ushort)code & 0x1f,nameChoice,buffer,bufferLength);
  }
  else {
    if (bufferLength != 0) {
      *buffer = '\0';
    }
    names_local._6_2_ = 0;
  }
  return names_local._6_2_;
}

Assistant:

static uint16_t
getName(UCharNames *names, uint32_t code, UCharNameChoice nameChoice,
        char *buffer, uint16_t bufferLength) {
    const uint16_t *group=getGroup(names, code);
    if((uint16_t)(code>>GROUP_SHIFT)==group[GROUP_MSB]) {
        return expandGroupName(names, group, (uint16_t)(code&GROUP_MASK), nameChoice,
                               buffer, bufferLength);
    } else {
        /* group not found */
        /* zero-terminate */
        if(bufferLength>0) {
            *buffer=0;
        }
        return 0;
    }
}